

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  ModuleField *pMVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  Expr *pEVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  ModuleField *pMVar7;
  Limits *pLVar8;
  undefined1 auVar9 [8];
  bool bVar10;
  Result RVar11;
  TokenType TVar12;
  _Head_base<0UL,_wabt::Import_*,_false> import;
  uint64_t uVar13;
  Enum EVar14;
  char *pcVar15;
  ExprListVector *this_00;
  __single_object elem_segment_field;
  ExprList elem_expr;
  Type elem_type;
  string name;
  Location loc;
  ModuleFieldList export_fields;
  undefined1 local_140 [8];
  Location local_138;
  Type local_110;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_108;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  Type local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  string local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ModuleFieldList local_98;
  Var local_78;
  
  RVar11 = Expect(this,Lpar);
  if (RVar11.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_78,this);
  uStack_b0 = (char *)CONCAT44(local_78.loc.filename._M_str._4_4_,local_78.loc.filename._M_str._0_4_
                              );
  local_a8 = CONCAT44(local_78.loc.field_1.field_0.first_column,local_78.loc.field_1.field_0.line);
  uStack_a0 = CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
  local_b8 = (_func_int **)local_78.loc.filename._M_len;
  RVar11 = Expect(this,Table);
  if (RVar11.enum_ == Error) {
    return (Result)Error;
  }
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ParseBindVarOpt(this,&local_d8);
  local_98.size_ = 0;
  local_98.first_ = (ModuleField *)0x0;
  local_98.last_ = (ModuleField *)0x0;
  EVar14 = Error;
  RVar11 = ParseInlineExports(this,&local_98,Table);
  pMVar7 = local_98.first_;
  if (RVar11.enum_ == Error) goto joined_r0x0015ef2a;
  bVar10 = PeekMatchLpar(this,Import);
  if (bVar10) {
    CheckImportOrdering(this,module);
    import._M_head_impl = (Import *)operator_new(0x90);
    ((import._M_head_impl)->module_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->module_name).field_2;
    ((import._M_head_impl)->module_name)._M_string_length = 0;
    ((import._M_head_impl)->module_name).field_2._M_local_buf[0] = '\0';
    ((import._M_head_impl)->field_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->field_name).field_2;
    ((import._M_head_impl)->field_name)._M_string_length = 0;
    ((import._M_head_impl)->field_name).field_2._M_local_buf[0] = '\0';
    (import._M_head_impl)->kind_ = Table;
    (import._M_head_impl)->_vptr_Import = (_func_int **)&PTR__TableImport_001e1610;
    import._M_head_impl[1]._vptr_Import =
         (_func_int **)&import._M_head_impl[1].module_name._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(import._M_head_impl + 1),local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    *(undefined8 *)((long)&import._M_head_impl[1].module_name.field_2 + 8) = 0;
    import._M_head_impl[1].field_name._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)((long)&import._M_head_impl[1].field_name._M_dataplus._M_p + 7) = 0;
    import._M_head_impl[1].field_name.field_2._M_allocated_capacity = 0xfffffff0;
    RVar11 = ParseInlineImport(this,import._M_head_impl);
    if (RVar11.enum_ != Error) {
      pLVar8 = (Limits *)((long)&import._M_head_impl[1].module_name.field_2 + 8);
      RVar11 = ParseLimitsIndex(this,pLVar8);
      if (((RVar11.enum_ != Error) && (RVar11 = ParseLimits(this,pLVar8), RVar11.enum_ != Error)) &&
         (RVar11 = ParseRefType(this,(Type *)&import._M_head_impl[1].field_name.field_2.
                                              _M_allocated_capacity), RVar11.enum_ != Error)) {
        GetToken((Token *)&local_78,this);
        local_138.filename._M_str._4_4_ = local_78.loc.filename._M_str._4_4_;
        local_138.filename._M_str._0_4_ = local_78.loc.filename._M_str._0_4_;
        local_138.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             CONCAT44(local_78.loc.field_1.field_0.first_column,local_78.loc.field_1.field_0.line);
        local_138.field_1._8_8_ =
             CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
        local_138.filename._M_len = local_78.loc.filename._M_len;
        local_e0._M_head_impl = (ImportModuleField *)operator_new(0x48);
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e1448;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename._M_len = local_138.filename._M_len;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename._M_str = local_138.filename._M_str;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.field_1.field_1.offset = local_138.field_1._0_8_;
        *(undefined8 *)
         ((long)&((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                 super_ModuleField.loc.field_1 + 8) = local_138.field_1._8_8_;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.type_ = Import;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001e15c0;
        ((local_e0._M_head_impl)->import)._M_t.
        super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
        super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = import._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_e0);
        if (local_e0._M_head_impl != (ImportModuleField *)0x0) {
          (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_e0._M_head_impl = (ImportModuleField *)0x0;
LAB_0015f202:
        anon_unknown_1::AppendInlineExportFields
                  (module,&local_98,
                   (int)((ulong)((long)(module->tables).
                                       super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->tables).
                                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar11 = Expect(this,Rpar);
        EVar14 = (Enum)(RVar11.enum_ == Error);
        pMVar7 = local_98.first_;
        goto joined_r0x0015ef2a;
      }
    }
  }
  else {
    import._M_head_impl = (Import *)operator_new(0x80);
    (((string *)
     &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
      super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)0x0;
    ((string *)
    &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
     super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    (((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e1448;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((TableModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->_M_local_buf +
     0x10) = (undefined4)local_a8;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((TableModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->_M_local_buf +
     0x14) = local_a8._4_4_;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((TableModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->_M_local_buf +
     0x18) = (undefined4)uStack_a0;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((TableModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->_M_local_buf +
     0x1c) = uStack_a0._4_4_;
    *(undefined4 *)
     &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
      super_ModuleField.loc = (undefined4)local_b8;
    *(undefined4 *)
     ((long)&(((TableModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 4) =
         local_b8._4_4_;
    *(undefined4 *)
     ((long)&(((TableModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 8) =
         (undefined4)uStack_b0;
    *(undefined4 *)
     ((long)&(((TableModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 0xc) =
         uStack_b0._4_4_;
    *(undefined4 *)
     &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
      super_ModuleField.type_ = 5;
    (((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__TableModuleField_001e17a0;
    (((TableModuleField *)import._M_head_impl)->table).name._M_dataplus =
         (_Alloc_hider)&(((TableModuleField *)import._M_head_impl)->table).name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&((TableModuleField *)import._M_head_impl)->table,local_d8._M_dataplus._M_p
               ,local_d8._M_dataplus._M_p + local_d8._M_string_length);
    pLVar8 = &(((TableModuleField *)import._M_head_impl)->table).elem_limits;
    (((TableModuleField *)import._M_head_impl)->table).elem_limits.initial = 0;
    (((TableModuleField *)import._M_head_impl)->table).elem_limits.max = 0;
    *(undefined4 *)((long)&(((TableModuleField *)import._M_head_impl)->table).elem_limits.max + 7) =
         0;
    (((TableModuleField *)import._M_head_impl)->table).elem_type.enum_ = FuncRef;
    (((TableModuleField *)import._M_head_impl)->table).elem_type.type_index_ = 0;
    RVar11 = ParseLimitsIndex(this,pLVar8);
    if (RVar11.enum_ != Error) {
      TVar12 = Peek(this,0);
      if (TVar12 == First_Type) {
        RVar11 = ParseRefType(this,&local_e8);
        if (((RVar11.enum_ != Error) && (RVar11 = Expect(this,Lpar), RVar11.enum_ != Error)) &&
           (RVar11 = Expect(this,Elem), RVar11.enum_ != Error)) {
          std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>((Location *)local_140);
          auVar9 = local_140;
          ppTVar2 = (module->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppTVar3 = (module->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          GetToken((Token *)&local_78,this);
          local_138.filename._M_len = local_78.loc.filename._M_len;
          Var::Var(&local_78,(Index)((ulong)((long)ppTVar2 - (long)ppTVar3) >> 3),
                   (Location *)(local_140 + 8));
          Var::operator=(&((ElemSegment *)((long)auVar9 + 0x40))->table_var,&local_78);
          Var::~Var(&local_78);
          local_78.loc.field_1.field_0.line = 0;
          local_78.loc.field_1.field_0.first_column = 0;
          local_78.loc.field_1.field_0.last_column = 0;
          local_78.loc.filename._M_len = 0;
          local_78.loc.filename._M_str._0_4_ = 0;
          local_78.loc.filename._M_str._4_4_ = 0;
          pcVar15 = (char *)0xfffffffe;
          if ((((TableModuleField *)import._M_head_impl)->table).elem_limits.is_64 == false) {
            pcVar15 = (char *)0xffffffff;
          }
          local_f0._M_head_impl = (Expr *)operator_new(0x90);
          ((local_f0._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          ((local_f0._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          ((local_f0._M_head_impl)->loc).filename._M_len = 0;
          ((local_f0._M_head_impl)->loc).filename._M_str = (char *)0x0;
          *(undefined8 *)((long)&((local_f0._M_head_impl)->loc).filename._M_str + 4) = 0;
          *(undefined8 *)((long)&((local_f0._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
          (local_f0._M_head_impl)->type_ = Const;
          (local_f0._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_001e2060;
          local_f0._M_head_impl[1]._vptr_Expr = (_func_int **)local_78.loc.filename._M_len;
          local_f0._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ =
               (Expr *)CONCAT44(local_78.loc.filename._M_str._4_4_,
                                local_78.loc.filename._M_str._0_4_);
          local_f0._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ =
               (Expr *)CONCAT44(local_78.loc.field_1.field_0.first_column,
                                local_78.loc.field_1.field_0.line);
          local_f0._M_head_impl[1].loc.filename._M_len =
               CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
          local_f0._M_head_impl[1].loc.filename._M_str = pcVar15;
          *(undefined4 *)&local_f0._M_head_impl[2]._vptr_Expr = 0;
          local_f0._M_head_impl[1].loc.field_1.field_1.offset = 0;
          *(undefined8 *)((long)&local_f0._M_head_impl[1].loc.field_1 + 8) = 0;
          intrusive_list<wabt::Expr>::push_back
                    (&((ElemSegment *)((long)auVar9 + 0x40))->offset,
                     (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
          if (local_f0._M_head_impl != (Expr *)0x0) {
            (*(local_f0._M_head_impl)->_vptr_Expr[1])();
          }
          local_f0._M_head_impl = (Expr *)0x0;
          if ((((ElemSegment *)((long)auVar9 + 0x40))->offset).size_ == 0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,400,
                          "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                         );
          }
          pEVar4 = (((ElemSegment *)((long)auVar9 + 0x40))->offset).last_;
          (pEVar4->loc).field_1.field_1.offset = local_a8;
          *(undefined8 *)((long)&(pEVar4->loc).field_1 + 8) = uStack_a0;
          (pEVar4->loc).filename._M_len = (size_t)local_b8;
          (pEVar4->loc).filename._M_str = uStack_b0;
          local_110 = local_e8;
          ((ElemSegment *)((long)auVar9 + 0x40))->elem_type = local_e8;
          local_138.filename._M_len = 0;
          local_138.filename._M_str = (char *)0x0;
          local_138.field_1._0_8_ = 0;
          bVar10 = ParseElemExprOpt(this,(ExprList *)(local_140 + 8));
          this_00 = &((ElemSegment *)((long)auVar9 + 0x40))->elem_exprs;
          if (bVar10) {
            std::
            vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
            ::emplace_back<wabt::intrusive_list<wabt::Expr>>
                      ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                        *)this_00,(intrusive_list<wabt::Expr> *)(local_140 + 8));
            ParseElemExprListOpt(this,this_00);
          }
          else {
            ParseElemExprVarListOpt(this,this_00);
          }
          RVar11 = Expect(this,Rpar);
          pp_Var6 = (_func_int **)local_138.filename._M_len;
          if (RVar11.enum_ != Error) {
            uVar13 = ((long)(((ElemSegment *)((long)auVar9 + 0x40))->elem_exprs).
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(((ElemSegment *)((long)auVar9 + 0x40))->elem_exprs).
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            (((TableModuleField *)import._M_head_impl)->table).elem_limits.initial = uVar13;
            (((TableModuleField *)import._M_head_impl)->table).elem_limits.max = uVar13;
            (((TableModuleField *)import._M_head_impl)->table).elem_limits.has_max = true;
            *(Type *)&(((TableModuleField *)import._M_head_impl)->table).elem_type.enum_ = local_110
            ;
            local_f8._M_head_impl = (TableModuleField *)import._M_head_impl;
            Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                        *)&local_f8);
            if (local_f8._M_head_impl != (TableModuleField *)0x0) {
              (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_f8._M_head_impl = (TableModuleField *)0x0;
            local_100._M_head_impl = (ElemSegmentModuleField *)local_140;
            local_140 = (undefined1  [8])0x0;
            Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                        *)&local_100);
            if (local_100._M_head_impl != (ElemSegmentModuleField *)0x0) {
              (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_100._M_head_impl = (ElemSegmentModuleField *)0x0;
            import._M_head_impl = (Import *)0x0;
            pp_Var6 = (_func_int **)local_138.filename._M_len;
          }
          while (pp_Var6 != (_func_int **)0x0) {
            pp_Var5 = (_func_int **)pp_Var6[1];
            (**(code **)(*pp_Var6 + 8))();
            pp_Var6 = pp_Var5;
          }
          if (local_140 != (undefined1  [8])0x0) {
            (*(((ElemSegmentModuleField *)local_140)->
              super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField
              [1])();
          }
          if (RVar11.enum_ != Error) goto LAB_0015f1f4;
        }
      }
      else {
        RVar11 = ParseLimits(this,pLVar8);
        if ((RVar11.enum_ != Error) &&
           (RVar11 = ParseRefType(this,&(((TableModuleField *)import._M_head_impl)->table).elem_type
                                 ), RVar11.enum_ != Error)) {
          local_108._M_head_impl = (TableModuleField *)import._M_head_impl;
          Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                      *)&local_108);
          if (local_108._M_head_impl != (TableModuleField *)0x0) {
            (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_108._M_head_impl = (TableModuleField *)0x0;
          import._M_head_impl = (Import *)0x0;
LAB_0015f1f4:
          if ((TableModuleField *)import._M_head_impl != (TableModuleField *)0x0) {
            (*(((TableModuleField *)import._M_head_impl)->
              super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField._vptr_ModuleField
              [1])(import._M_head_impl);
          }
          goto LAB_0015f202;
        }
      }
    }
    pMVar7 = local_98.first_;
    if ((TableModuleField *)import._M_head_impl == (TableModuleField *)0x0) goto joined_r0x0015ef2a;
  }
  (*(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
    super_ModuleField._vptr_ModuleField[1])(import._M_head_impl);
  pMVar7 = local_98.first_;
joined_r0x0015ef2a:
  while (pMVar7 != (ModuleField *)0x0) {
    pMVar1 = (pMVar7->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar7->_vptr_ModuleField[1])();
    pMVar7 = pMVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar14;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    auto& table = field->table;
    CHECK_RESULT(ParseLimitsIndex(&table.elem_limits));
    if (PeekMatch(TokenType::ValueType)) {
      Type elem_type;
      CHECK_RESULT(ParseRefType(&elem_type));

      EXPECT(Lpar);
      EXPECT(Elem);

      auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
      ElemSegment& elem_segment = elem_segment_field->elem_segment;
      elem_segment.table_var = Var(module->tables.size(), GetLocation());
      auto offset = table.elem_limits.is_64 ? Const::I64(0) : Const::I32(0);
      elem_segment.offset.push_back(std::make_unique<ConstExpr>(offset));
      elem_segment.offset.back().loc = loc;
      elem_segment.elem_type = elem_type;
      // Syntax is either an optional list of var (legacy), or a non-empty list
      // of elem expr.
      ExprList elem_expr;
      if (ParseElemExprOpt(&elem_expr)) {
        elem_segment.elem_exprs.push_back(std::move(elem_expr));
        // Parse the rest.
        ParseElemExprListOpt(&elem_segment.elem_exprs);
      } else {
        ParseElemExprVarListOpt(&elem_segment.elem_exprs);
      }
      EXPECT(Rpar);

      table.elem_limits.initial = elem_segment.elem_exprs.size();
      table.elem_limits.max = elem_segment.elem_exprs.size();
      table.elem_limits.has_max = true;
      table.elem_type = elem_type;
      module->AppendField(std::move(field));
      module->AppendField(std::move(elem_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&table.elem_limits));
      CHECK_RESULT(ParseRefType(&table.elem_type));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}